

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall
despot::TagHistoryModePolicy::TagHistoryModePolicy
          (TagHistoryModePolicy *this,DSPOMDP *model,ParticleLowerBound *bound)

{
  int iVar1;
  BaseTag *pBVar2;
  
  despot::DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  *(undefined ***)this = &PTR__TagHistoryModePolicy_001218e8;
  pBVar2 = (BaseTag *)(model + -0x38);
  if (model == (DSPOMDP *)0x0) {
    pBVar2 = (BaseTag *)0x0;
  }
  this->tag_model_ = pBVar2;
  despot::Floor::Floor(&this->floor_);
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Floor::operator=(&this->floor_,&this->tag_model_->floor_);
  iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->state_probs_,(long)iVar1);
  iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x18))();
  std::
  vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::resize(&this->paths_,(long)iVar1);
  this->belief_ = (Belief *)0x0;
  return;
}

Assistant:

TagHistoryModePolicy(const DSPOMDP* model, ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	tag_model_(static_cast<const BaseTag*>(model)) {
		floor_ = tag_model_->floor();
		state_probs_.resize(tag_model_->NumStates());
		paths_.resize(tag_model_->NumActions());
		belief_ = NULL;
	}